

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O2

void __thiscall CExtKey::Encode(CExtKey *this,uchar *code)

{
  uint uVar1;
  long lVar2;
  array<unsigned_char,_32UL> *paVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  *code = this->nDepth;
  *(undefined4 *)(code + 1) = *(undefined4 *)this->vchFingerprint;
  uVar1 = this->nChild;
  *(uint *)(code + 5) =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar4 = *(undefined4 *)((this->chaincode).super_base_blob<256U>.m_data._M_elems + 4);
  uVar5 = *(undefined4 *)((this->chaincode).super_base_blob<256U>.m_data._M_elems + 8);
  uVar6 = *(undefined4 *)((this->chaincode).super_base_blob<256U>.m_data._M_elems + 0xc);
  uVar7 = *(undefined4 *)((this->chaincode).super_base_blob<256U>.m_data._M_elems + 0x10);
  uVar8 = *(undefined4 *)((this->chaincode).super_base_blob<256U>.m_data._M_elems + 0x14);
  uVar9 = *(undefined4 *)((this->chaincode).super_base_blob<256U>.m_data._M_elems + 0x18);
  uVar10 = *(undefined4 *)((this->chaincode).super_base_blob<256U>.m_data._M_elems + 0x1c);
  *(undefined4 *)(code + 9) = *(undefined4 *)(this->chaincode).super_base_blob<256U>.m_data._M_elems
  ;
  *(undefined4 *)(code + 0xd) = uVar4;
  *(undefined4 *)(code + 0x11) = uVar5;
  *(undefined4 *)(code + 0x15) = uVar6;
  *(undefined4 *)(code + 0x19) = uVar7;
  *(undefined4 *)(code + 0x1d) = uVar8;
  *(undefined4 *)(code + 0x21) = uVar9;
  *(undefined4 *)(code + 0x25) = uVar10;
  code[0x29] = '\0';
  paVar3 = (this->key).keydata._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
  if (paVar3 == (array<unsigned_char,_32UL> *)0x0) {
    __assert_fail("key.size() == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                  ,0x18c,"void CExtKey::Encode(unsigned char *) const");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    uVar11 = *(undefined8 *)paVar3->_M_elems;
    uVar12 = *(undefined8 *)(paVar3->_M_elems + 8);
    uVar13 = *(undefined8 *)(paVar3->_M_elems + 0x18);
    *(undefined8 *)(code + 0x3a) = *(undefined8 *)(paVar3->_M_elems + 0x10);
    *(undefined8 *)(code + 0x42) = uVar13;
    *(undefined8 *)(code + 0x2a) = uVar11;
    *(undefined8 *)(code + 0x32) = uVar12;
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CExtKey::Encode(unsigned char code[BIP32_EXTKEY_SIZE]) const {
    code[0] = nDepth;
    memcpy(code+1, vchFingerprint, 4);
    WriteBE32(code+5, nChild);
    memcpy(code+9, chaincode.begin(), 32);
    code[41] = 0;
    assert(key.size() == 32);
    memcpy(code+42, key.begin(), 32);
}